

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O0

void __thiscall DSaveMenu::DSaveMenu(DSaveMenu *this,DMenu *parent,FListMenuDescriptor *desc)

{
  char *__src;
  FSaveGameNode *local_38 [3];
  FListMenuDescriptor *local_20;
  FListMenuDescriptor *desc_local;
  DMenu *parent_local;
  DSaveMenu *this_local;
  
  local_20 = desc;
  desc_local = (FListMenuDescriptor *)parent;
  parent_local = (DMenu *)this;
  DLoadSaveMenu::DLoadSaveMenu(&this->super_DLoadSaveMenu,parent,desc);
  (this->super_DLoadSaveMenu).super_DListMenu.super_DMenu.super_DObject._vptr_DObject =
       (_func_int **)&PTR_StaticType_00b62de8;
  FSaveGameNode::FSaveGameNode(&this->NewSaveNode);
  __src = FStringTable::operator[](&GStrings,"NEWSAVE");
  strcpy((this->NewSaveNode).Title,__src);
  local_38[0] = &this->NewSaveNode;
  (this->NewSaveNode).bNoDelete = true;
  TArray<FSaveGameNode_*,_FSaveGameNode_*>::Insert(&DLoadSaveMenu::SaveGames,0,local_38);
  (this->super_DLoadSaveMenu).TopItem = 0;
  if (DLoadSaveMenu::LastSaved == -1) {
    (this->super_DLoadSaveMenu).Selected = 0;
  }
  else {
    (this->super_DLoadSaveMenu).Selected = DLoadSaveMenu::LastSaved + 1;
  }
  DLoadSaveMenu::ExtractSaveData(&this->super_DLoadSaveMenu,(this->super_DLoadSaveMenu).Selected);
  return;
}

Assistant:

DSaveMenu::DSaveMenu(DMenu *parent, FListMenuDescriptor *desc)
: DLoadSaveMenu(parent, desc)
{
	strcpy (NewSaveNode.Title, GStrings["NEWSAVE"]);
	NewSaveNode.bNoDelete = true;
	SaveGames.Insert(0, &NewSaveNode);
	TopItem = 0;
	if (LastSaved == -1)
	{
		Selected = 0;
	}
	else
	{
		Selected = LastSaved + 1;
	}
	ExtractSaveData (Selected);
}